

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O3

int AF__FTranslatedLineTarget_TraceBleed
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int damage;
  FTranslatedLineTarget *t;
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  AActor *puff;
  char *pcVar4;
  bool bVar5;
  PClass *pPVar3;
  
  if (numparam < 1) {
    pcVar4 = "(paramnum) < numparam";
LAB_0041763f:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x12b0,
                  "int AF__FTranslatedLineTarget_TraceBleed(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if ((param->field_0).field_3.Type != '\x03') {
    pcVar4 = "param[paramnum].Type == REGT_POINTER";
    goto LAB_0041763f;
  }
  if (numparam == 1) {
    pcVar4 = "(paramnum) < numparam";
LAB_00417667:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x12b1,
                  "int AF__FTranslatedLineTarget_TraceBleed(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[1].field_0.field_3.Type != '\0') {
    pcVar4 = "param[paramnum].Type == REGT_INT";
    goto LAB_00417667;
  }
  if ((uint)numparam < 3) {
    pcVar4 = "(paramnum) < numparam";
    goto LAB_0041768f;
  }
  if (param[2].field_0.field_3.Type != '\x03') {
LAB_00417626:
    pcVar4 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
    goto LAB_0041768f;
  }
  t = (FTranslatedLineTarget *)(param->field_0).field_1.a;
  damage = param[1].field_0.i;
  puff = (AActor *)param[2].field_0.field_1.a;
  if (param[2].field_0.field_1.atag == 1) {
    if (puff == (AActor *)0x0) goto LAB_0041759b;
  }
  else {
    if (puff != (AActor *)0x0) goto LAB_00417626;
LAB_0041759b:
    NullParam("\"missile\"");
    puff = (AActor *)param[2].field_0.field_1.a;
    if (puff == (AActor *)0x0) {
      puff = (AActor *)0x0;
      goto LAB_00417614;
    }
  }
  pPVar1 = AActor::RegistrationInfo.MyClass;
  pPVar3 = (puff->super_DThinker).super_DObject.Class;
  if (pPVar3 == (PClass *)0x0) {
    iVar2 = (**(puff->super_DThinker).super_DObject._vptr_DObject)(puff);
    pPVar3 = (PClass *)CONCAT44(extraout_var,iVar2);
    (puff->super_DThinker).super_DObject.Class = pPVar3;
  }
  bVar5 = pPVar3 != (PClass *)0x0;
  if (pPVar3 != pPVar1 && bVar5) {
    do {
      pPVar3 = pPVar3->ParentClass;
      bVar5 = pPVar3 != (PClass *)0x0;
      if (pPVar3 == pPVar1) break;
    } while (pPVar3 != (PClass *)0x0);
  }
  if (!bVar5) {
    pcVar4 = "missile == NULL || missile->IsKindOf(RUNTIME_CLASS(AActor))";
LAB_0041768f:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x12b2,
                  "int AF__FTranslatedLineTarget_TraceBleed(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
LAB_00417614:
  P_TraceBleed(damage,t,puff);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(_FTranslatedLineTarget, TraceBleed)
{
	PARAM_SELF_STRUCT_PROLOGUE(FTranslatedLineTarget);
	PARAM_INT(damage);
	PARAM_OBJECT_NOT_NULL(missile, AActor);

	P_TraceBleed(damage, self, missile);
	return 0;
}